

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_FromArrayConstructor_Test::~GslSpan_FromArrayConstructor_Test
          (GslSpan_FromArrayConstructor_Test *this)

{
  GslSpan_FromArrayConstructor_Test *this_local;
  
  ~GslSpan_FromArrayConstructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FromArrayConstructor) {
    int arr[5] = {1, 2, 3, 4, 5};

    {
        span<int> s{arr};
        EXPECT_EQ (s.length (), 5);
        EXPECT_EQ (s.data (), &arr[0]);
    }
    {
        span<int, 5> s{arr};
        EXPECT_EQ (s.length (), 5);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    int arr2d[2][3] = {{1, 2, 3}, {4, 5, 6}};

#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 6> s{arr}; }
    {
        span<int, 0> s{arr};
        EXPECT_EQ (s.length () == 0 && s.data (), &arr[0]);
    }
    {
        span<int> s{arr2d};
        EXPECT_EQ (s.length () == 6 && s.data (), &arr2d[0][0]);
        EXPECT_EQ (s[0] == 1 && s[5], 6);
    }
    {
        span<int, 0> s{arr2d};
        EXPECT_EQ (s.length () == 0 && s.data (), &arr2d[0][0]);
    }
    { span<int, 6> s{arr2d}; }
#endif
    {
        span<int[3]> s{&(arr2d[0]), 1};
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr2d[0]);
    }

    int arr3d[2][3][2] = {{{1, 2}, {3, 4}, {5, 6}}, {{7, 8}, {9, 10}, {11, 12}}};

#ifdef CONFIRM_COMPILATION_ERRORS
    {
        span<int> s{arr3d};
        EXPECT_EQ (s.length () == 12 && s.data (), &arr3d[0][0][0]);
        EXPECT_EQ (s[0] == 1 && s[11], 12);
    }
    {
        span<int, 0> s{arr3d};
        EXPECT_EQ (s.length () == 0 && s.data (), &arr3d[0][0][0]);
    }
    { span<int, 11> s{arr3d}; }
    {
        span<int, 12> s{arr3d};
        EXPECT_EQ (s.length () == 12 && s.data (), &arr3d[0][0][0]);
        EXPECT_EQ (s[0] == 1 && s[5], 6);
    }
#endif
    {
        span<int[3][2]> s{&arr3d[0], 1};
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr3d[0]);
    }
    {
        auto s = make_span (arr);
        EXPECT_EQ (decltype (s)::extent, 5);
        EXPECT_EQ (s.length (), 5);
        EXPECT_EQ (s.data (), &arr[0]);
    }
    {
        auto s = make_span (&(arr2d[0]), 1);
        EXPECT_EQ (decltype (s)::extent, dynamic_extent);
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr2d[0]);
    }
    {
        auto s = make_span (&arr3d[0], 1);
        EXPECT_EQ (decltype (s)::extent, dynamic_extent);
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr3d[0]);
    }
}